

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Enum args_2)

{
  initializer_list<wabt::Type> __l;
  char *desc_00;
  bool bVar1;
  allocator<wabt::Type> local_81;
  Type local_80;
  Type local_78;
  Type TStack_70;
  iterator local_68;
  size_type local_60;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  Result local_3c;
  Enum local_38;
  Enum local_34;
  char *pcStack_30;
  Enum args_local_2;
  char *desc_local;
  TypeChecker *this_local;
  Type args_local_1;
  Type args_local;
  Result result_local;
  
  local_38 = result.enum_;
  local_34 = args_2;
  pcStack_30 = desc;
  desc_local = (char *)this;
  unique0x10000113 = args_1;
  args_local_1 = args;
  bVar1 = Failed(result);
  desc_00 = pcStack_30;
  if (bVar1) {
    local_80 = args_local_1;
    local_78 = stack0xffffffffffffffe4;
    local_3c.enum_ = result.enum_;
    Type::Type(&TStack_70,local_34);
    local_68 = &local_80;
    local_60 = 3;
    std::allocator<wabt::Type>::allocator(&local_81);
    __l._M_len = local_60;
    __l._M_array = local_68;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_58,__l,&local_81);
    PrintStackIfFailedV(this,local_3c,desc_00,&local_58,false);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_58);
    std::allocator<wabt::Type>::~allocator(&local_81);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Assert all args are Type or Type::Enum. If it's a TypeVector then
    // PrintStackIfFailedV() should be used instead.
    static_assert((std::is_constructible_v<Type, Args> && ...));
    // Minor optimization, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailedV(result, desc, {args...}, /*is_end=*/false);
    }
  }